

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlTextWriterWriteBinHex(void)

{
  int iVar1;
  int iVar2;
  int val;
  int val_00;
  xmlTextWriterPtr val_01;
  char *__s;
  size_t sVar3;
  int local_44;
  int n_len;
  int len;
  int n_start;
  int start;
  int n_data;
  char *data;
  int n_writer;
  xmlTextWriterPtr writer;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (data._4_4_ = 0; (int)data._4_4_ < 2; data._4_4_ = data._4_4_ + 1) {
    for (n_start = 0; n_start < 4; n_start = n_start + 1) {
      for (n_len = 0; n_len < 4; n_len = n_len + 1) {
        for (local_44 = 0; local_44 < 4; local_44 = local_44 + 1) {
          iVar1 = xmlMemBlocks();
          val_01 = gen_xmlTextWriterPtr(data._4_4_,0);
          __s = gen_const_char_ptr(n_start,1);
          iVar2 = gen_int(n_len,2);
          val = gen_int(local_44,3);
          if (((__s == (char *)0x0) || (sVar3 = strlen(__s), iVar2 <= (int)sVar3 + 1)) &&
             ((__s == (char *)0x0 || (sVar3 = strlen(__s), val <= (int)sVar3 + 1)))) {
            val_00 = xmlTextWriterWriteBinHex(val_01,__s,iVar2,val);
            desret_int(val_00);
            call_tests = call_tests + 1;
            des_xmlTextWriterPtr(data._4_4_,val_01,0);
            des_const_char_ptr(n_start,__s,1);
            des_int(n_len,iVar2,2);
            des_int(local_44,val,3);
            xmlResetLastError();
            iVar2 = xmlMemBlocks();
            if (iVar1 != iVar2) {
              iVar2 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextWriterWriteBinHex",
                     (ulong)(uint)(iVar2 - iVar1));
              ret_val = ret_val + 1;
              printf(" %d",(ulong)data._4_4_);
              printf(" %d",(ulong)(uint)n_start);
              printf(" %d",(ulong)(uint)n_len);
              printf(" %d");
              printf("\n");
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlTextWriterWriteBinHex(void) {
    int test_ret = 0;

#if defined(LIBXML_WRITER_ENABLED)
    int mem_base;
    int ret_val;
    xmlTextWriterPtr writer; /* the xmlTextWriterPtr */
    int n_writer;
    char * data; /* binary data */
    int n_data;
    int start; /* the position within the data of the first byte to encode */
    int n_start;
    int len; /* the number of bytes to encode */
    int n_len;

    for (n_writer = 0;n_writer < gen_nb_xmlTextWriterPtr;n_writer++) {
    for (n_data = 0;n_data < gen_nb_const_char_ptr;n_data++) {
    for (n_start = 0;n_start < gen_nb_int;n_start++) {
    for (n_len = 0;n_len < gen_nb_int;n_len++) {
        mem_base = xmlMemBlocks();
        writer = gen_xmlTextWriterPtr(n_writer, 0);
        data = gen_const_char_ptr(n_data, 1);
        start = gen_int(n_start, 2);
        len = gen_int(n_len, 3);
        if ((data != NULL) &&
            (start > (int) strlen((const char *) data) + 1))
            continue;
        if ((data != NULL) &&
            (len > (int) strlen((const char *) data) + 1))
            continue;

        ret_val = xmlTextWriterWriteBinHex(writer, (const char *)data, start, len);
        desret_int(ret_val);
        call_tests++;
        des_xmlTextWriterPtr(n_writer, writer, 0);
        des_const_char_ptr(n_data, (const char *)data, 1);
        des_int(n_start, start, 2);
        des_int(n_len, len, 3);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlTextWriterWriteBinHex",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_writer);
            printf(" %d", n_data);
            printf(" %d", n_start);
            printf(" %d", n_len);
            printf("\n");
        }
    }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}